

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

DynamicState * __thiscall
vkt::Draw::PipelineCreateInfo::DynamicState::operator=(DynamicState *this,DynamicState *other)

{
  uint uVar1;
  VkDynamicState *__first;
  reference pvVar2;
  allocator<vk::VkDynamicState> local_31;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_30;
  DynamicState *local_18;
  DynamicState *other_local;
  DynamicState *this_local;
  
  (this->super_VkPipelineDynamicStateCreateInfo).sType =
       (other->super_VkPipelineDynamicStateCreateInfo).sType;
  (this->super_VkPipelineDynamicStateCreateInfo).pNext =
       (other->super_VkPipelineDynamicStateCreateInfo).pNext;
  (this->super_VkPipelineDynamicStateCreateInfo).flags =
       (other->super_VkPipelineDynamicStateCreateInfo).flags;
  (this->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount =
       (other->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount;
  __first = (other->super_VkPipelineDynamicStateCreateInfo).pDynamicStates;
  uVar1 = (this->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount;
  local_18 = other;
  other_local = this;
  std::allocator<vk::VkDynamicState>::allocator(&local_31);
  std::vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>>::
  vector<vk::VkDynamicState_const*,void>
            ((vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)&local_30,__first,
             __first + uVar1,&local_31);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator=
            (&this->m_dynamicStates,&local_30);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~vector(&local_30);
  std::allocator<vk::VkDynamicState>::~allocator(&local_31);
  pvVar2 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator[]
                     (&this->m_dynamicStates,0);
  (this->super_VkPipelineDynamicStateCreateInfo).pDynamicStates = pvVar2;
  return this;
}

Assistant:

PipelineCreateInfo::DynamicState& PipelineCreateInfo::DynamicState::operator= (const DynamicState& other)
{
	sType = other.sType;
	pNext = other.pNext;

	flags				= other.flags;
	dynamicStateCount	= other.dynamicStateCount;
	m_dynamicStates		= std::vector<vk::VkDynamicState>(other.pDynamicStates, other.pDynamicStates + dynamicStateCount);
	pDynamicStates		= &m_dynamicStates[0];

	return *this;
}